

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_arg_test.cc
# Opt level: O2

void re2::REArgTestInt16Test(void)

{
  char cVar1;
  char *__s;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  int16 r;
  LogMessageFatal local_1b0;
  
  for (lVar5 = 0x10; lVar5 != 0x268; lVar5 = lVar5 + 0x18) {
    __s = *(char **)((long)&PTR__GLOBAL__sub_I_test_cc_0014a140 + lVar5);
    sVar3 = strlen(__s);
    bVar2 = RE2::Arg::parse_short(__s,(int)sVar3,&r);
    cVar1 = *(char *)((long)&kSuccessTable + lVar5);
    if ((bool)cVar1 != bVar2) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x6e);
      poVar4 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                               "Check failed: (retval) == (success)");
      poVar4 = std::operator<<(poVar4,"Parsing \'");
      poVar4 = std::operator<<(poVar4,__s);
      poVar4 = std::operator<<(poVar4,"\' for type int16 should return ");
      std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    if ((cVar1 != '\0') && (*(short *)((long)&__do_global_dtors_aux_fini_array_entry + lVar5) != r))
    {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x6e);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                      "Check failed: (r) == ((int16)kSuccessTable[i].value)");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
  }
  return;
}

Assistant:

TEST(REArgTest, Int16Test) {
  PARSE_FOR_TYPE(int16, 0);
}